

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O1

void Gia_ManLutSat(Gia_Man_t *pGia,int LutSize,int nNumber,int nImproves,int nBTLimit,int DelayMax,
                  int nEdges,int fDelay,int fReverse,int fVerbose,int fVeryVerbose)

{
  int *__ptr;
  int iVar1;
  int iVar2;
  Sbl_Man_t *p;
  long lVar3;
  long lVar4;
  
  p = Sbl_ManAlloc(pGia,nNumber);
  p->LutSize = LutSize;
  p->nBTLimit = nBTLimit;
  p->DelayMax = DelayMax;
  p->nEdges = nEdges;
  p->fDelay = fDelay;
  p->fReverse = fReverse;
  p->fVerbose = fVerbose | fVeryVerbose;
  p->fVeryVerbose = fVeryVerbose;
  if ((fVerbose | fVeryVerbose) != 0) {
    printf("Parameters: WinSize = %d AIG nodes.  Conf = %d.  DelayMax = %d.\n",(ulong)(uint)p->nVars
           ,(ulong)(uint)nBTLimit);
  }
  if (((fDelay != 0) && (pGia->vEdge1 != (Vec_Int_t *)0x0)) && (p->DelayMax == 0)) {
    iVar1 = Gia_ManEvalEdgeDelay(pGia);
    p->DelayMax = iVar1;
  }
  Gia_ManComputeOneWinStart(pGia,nNumber,fReverse);
  if (1 < pGia->nObjs) {
    iVar1 = 0;
    lVar4 = 1;
    lVar3 = 0x14;
    do {
      if (pGia->vMapping2->nSize <= lVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if (*(int *)((long)&pGia->vMapping2->pArray->nCap + lVar3) != 0) {
        iVar2 = Sbl_ManTestSat(p,(int)lVar4);
        if (iVar2 == 2) {
          iVar1 = iVar1 + 1;
          if (iVar1 == nImproves) break;
        }
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar4 < pGia->nObjs);
  }
  Gia_ManComputeOneWin
            (pGia,-1,(Vec_Int_t **)0x0,(Vec_Int_t **)0x0,(Vec_Int_t **)0x0,(Vec_Int_t **)0x0);
  if (p->fVerbose != 0) {
    printf("Tried = %d. Used = %d. HashWin = %d. SmallWin = %d. LargeWin = %d. IterOut = %d.  SAT runs = %d.\n"
           ,(ulong)(uint)p->nTried,(ulong)(uint)p->nImproved,(ulong)(uint)p->nHashWins,
           (ulong)(uint)p->nSmallWins,(ulong)(uint)p->nLargeWins,(ulong)(uint)p->nIterOuts,
           (ulong)(uint)p->nRuns);
  }
  if (p->fVerbose != 0) {
    Sbl_ManPrintRuntime(p);
  }
  Sbl_ManStop(p);
  if (pGia->vPacking != (Vec_Int_t *)0x0) {
    __ptr = pGia->vPacking->pArray;
    if (__ptr != (int *)0x0) {
      free(__ptr);
      pGia->vPacking->pArray = (int *)0x0;
    }
    if (pGia->vPacking != (Vec_Int_t *)0x0) {
      free(pGia->vPacking);
      pGia->vPacking = (Vec_Int_t *)0x0;
    }
  }
  return;
}

Assistant:

void Gia_ManLutSat( Gia_Man_t * pGia, int LutSize, int nNumber, int nImproves, int nBTLimit, int DelayMax, int nEdges, int fDelay, int fReverse, int fVerbose, int fVeryVerbose )
{
    int iLut, nImproveCount = 0;
    Sbl_Man_t * p   = Sbl_ManAlloc( pGia, nNumber );
    p->LutSize      = LutSize;      // LUT size
    p->nBTLimit     = nBTLimit;     // conflicts
    p->DelayMax     = DelayMax;     // external delay
    p->nEdges       = nEdges;       // the number of edges
    p->fDelay       = fDelay;       // delay mode
    p->fReverse     = fReverse;     // reverse windowing
    p->fVerbose     = fVerbose | fVeryVerbose;
    p->fVeryVerbose = fVeryVerbose;
    if ( p->fVerbose )
    printf( "Parameters: WinSize = %d AIG nodes.  Conf = %d.  DelayMax = %d.\n", p->nVars, p->nBTLimit, p->DelayMax );
    // determine delay limit
    if ( fDelay && pGia->vEdge1 && p->DelayMax == 0 )
        p->DelayMax = Gia_ManEvalEdgeDelay( pGia );
    // iterate through the internal nodes
    Gia_ManComputeOneWinStart( pGia, nNumber, fReverse );
    Gia_ManForEachLut2( pGia, iLut )
    {
        if ( Sbl_ManTestSat( p, iLut ) != 2 )
            continue;
        if ( ++nImproveCount == nImproves )
            break;
    }
    Gia_ManComputeOneWin( pGia, -1, NULL, NULL, NULL, NULL );
    if ( p->fVerbose )
    printf( "Tried = %d. Used = %d. HashWin = %d. SmallWin = %d. LargeWin = %d. IterOut = %d.  SAT runs = %d.\n", 
        p->nTried, p->nImproved, p->nHashWins, p->nSmallWins, p->nLargeWins, p->nIterOuts, p->nRuns );
    if ( p->fVerbose )
    Sbl_ManPrintRuntime( p );
    Sbl_ManStop( p );
    Vec_IntFreeP( &pGia->vPacking );
}